

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_generator.cc
# Opt level: O0

string * grpc_ts_generator::anon_unknown_1::GenerateNamespace
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *ns,string *filename,bool include_separator)

{
  bool bVar1;
  reference pbVar2;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string local_68;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  const_iterator it;
  allocator<char> local_23;
  undefined1 local_22;
  byte local_21;
  string *psStack_20;
  bool include_separator_local;
  string *filename_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ns_local;
  string *path;
  
  local_22 = 0;
  local_21 = include_separator;
  psStack_20 = filename;
  filename_local = (string *)ns;
  ns_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_23);
  std::allocator<char>::~allocator(&local_23);
  if ((local_21 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".");
  }
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(ns);
  while( true ) {
    local_48._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(ns);
    bVar1 = __gnu_cxx::operator<(&local_40,&local_48);
    if (!bVar1) break;
    if ((local_21 & 1) != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
    }
    if ((local_21 & 1) == 0) {
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_40);
      std::operator+(&local_68,pbVar2,"_");
    }
    else {
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_40);
      flatbuffers::ConvertCase(&local_68,pbVar2,kDasher,kUpperCamel);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator++(&local_40,0);
  }
  if ((local_21 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  }
  if ((local_21 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_90,(string *)filename);
  }
  else {
    flatbuffers::ConvertCase(&local_90,filename,kDasher,kUpperCamel);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

static grpc::string GenerateNamespace(const std::vector<std::string> ns,
                               const std::string filename,
                               const bool include_separator) {
  grpc::string path = "";
  if (include_separator) path += ".";

  for (auto it = ns.begin(); it < ns.end(); it++) {
    if (include_separator) path += "/";
    path += include_separator
                ? flatbuffers::ConvertCase(*it, flatbuffers::Case::kDasher,
                                           flatbuffers::Case::kUpperCamel)
                : *it + "_";
  }

  if (include_separator) path += "/";
  path += include_separator
              ? flatbuffers::ConvertCase(filename, flatbuffers::Case::kDasher,
                                         flatbuffers::Case::kUpperCamel)
              : filename;
  return path;
}